

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

int BrotliDecoderStateInit
              (BrotliDecoderStateInternal *s,brotli_alloc_func alloc_func,brotli_free_func free_func
              ,void *opaque)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  BrotliDictionary *pBVar3;
  BrotliTransforms *pBVar4;
  void *opaque_local;
  brotli_free_func free_func_local;
  brotli_alloc_func alloc_func_local;
  BrotliDecoderStateInternal *s_local;
  
  if (alloc_func == (brotli_alloc_func)0x0) {
    s->alloc_func = BrotliDefaultAllocFunc;
    s->free_func = BrotliDefaultFreeFunc;
    s->memory_manager_opaque = (void *)0x0;
  }
  else {
    s->alloc_func = alloc_func;
    s->free_func = free_func;
    s->memory_manager_opaque = opaque;
  }
  s->error_code = 0;
  BrotliInitBitReader(&s->br);
  s->state = BROTLI_STATE_UNINITED;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xffdf;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  s->buffer_length = 0;
  s->loop_counter = 0;
  s->pos = 0;
  s->rb_roundtrips = 0;
  s->partial_pos_out = 0;
  s->commands = (BackwardReferenceFromDecoder *)0x0;
  s->commands_size = 0;
  if ((*(ushort *)&s->field_0x338 >> 6 & 1) != 0) {
    puVar1 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,20000);
    (s->literals_block_splits).types = puVar1;
    puVar2 = (uint32_t *)(*s->alloc_func)(s->memory_manager_opaque,80000);
    (s->literals_block_splits).positions_begin = puVar2;
    puVar2 = (uint32_t *)(*s->alloc_func)(s->memory_manager_opaque,80000);
    (s->literals_block_splits).positions_end = puVar2;
    (s->literals_block_splits).num_types = 0;
    (s->literals_block_splits).num_types_prev_metablocks = 0;
    (s->literals_block_splits).num_blocks = 0;
    (s->literals_block_splits).types_alloc_size = 20000;
    (s->literals_block_splits).positions_alloc_size = 20000;
    puVar1 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,20000);
    (s->insert_copy_length_block_splits).types = puVar1;
    puVar2 = (uint32_t *)(*s->alloc_func)(s->memory_manager_opaque,80000);
    (s->insert_copy_length_block_splits).positions_begin = puVar2;
    puVar2 = (uint32_t *)(*s->alloc_func)(s->memory_manager_opaque,80000);
    (s->insert_copy_length_block_splits).positions_end = puVar2;
    (s->insert_copy_length_block_splits).num_types = 0;
    (s->insert_copy_length_block_splits).num_types_prev_metablocks = 0;
    (s->insert_copy_length_block_splits).num_blocks = 0;
    (s->insert_copy_length_block_splits).types_alloc_size = 20000;
    (s->insert_copy_length_block_splits).positions_alloc_size = 20000;
  }
  s->saved_position_literals_begin = 0;
  s->saved_position_lengths_begin = 0;
  s->block_type_trees = (HuffmanCode *)0x0;
  s->block_len_trees = (HuffmanCode *)0x0;
  s->ringbuffer = (uint8_t *)0x0;
  s->ringbuffer_size = 0;
  s->new_ringbuffer_size = 0;
  s->ringbuffer_mask = 0;
  s->context_map = (uint8_t *)0x0;
  s->context_modes = (uint8_t *)0x0;
  s->dist_context_map = (uint8_t *)0x0;
  s->context_map_slice = (uint8_t *)0x0;
  s->dist_context_map_slice = (uint8_t *)0x0;
  (s->literal_hgroup).codes = (HuffmanCode *)0x0;
  (s->literal_hgroup).htrees = (HuffmanCode **)0x0;
  (s->insert_copy_hgroup).codes = (HuffmanCode *)0x0;
  (s->insert_copy_hgroup).htrees = (HuffmanCode **)0x0;
  (s->distance_hgroup).codes = (HuffmanCode *)0x0;
  (s->distance_hgroup).htrees = (HuffmanCode **)0x0;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xfffe;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xfffd;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xfffb;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xfff7;
  *(ushort *)&s->field_0x338 = *(ushort *)&s->field_0x338 & 0xffef | 0x10;
  s->window_bits = 0;
  s->max_distance = 0;
  s->dist_rb[0] = 0x10;
  s->dist_rb[1] = 0xf;
  s->dist_rb[2] = 0xb;
  s->dist_rb[3] = 4;
  s->dist_rb_idx = 0;
  s->block_type_trees = (HuffmanCode *)0x0;
  s->block_len_trees = (HuffmanCode *)0x0;
  s->mtf_upper_bound = 0x3f;
  pBVar3 = BrotliGetDictionary();
  s->dictionary = pBVar3;
  pBVar4 = BrotliGetTransforms();
  s->transforms = pBVar4;
  return 1;
}

Assistant:

BROTLI_BOOL BrotliDecoderStateInit(BrotliDecoderState* s,
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  if (!alloc_func) {
    s->alloc_func = BrotliDefaultAllocFunc;
    s->free_func = BrotliDefaultFreeFunc;
    s->memory_manager_opaque = 0;
  } else {
    s->alloc_func = alloc_func;
    s->free_func = free_func;
    s->memory_manager_opaque = opaque;
  }

  s->error_code = 0; /* BROTLI_DECODER_NO_ERROR */

  BrotliInitBitReader(&s->br);
  s->state = BROTLI_STATE_UNINITED;
  s->large_window = 0;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;

  s->buffer_length = 0;
  s->loop_counter = 0;
  s->pos = 0;
  s->rb_roundtrips = 0;
  s->partial_pos_out = 0;

  s->commands = NULL;
  s->commands_size = 0;
  if (s->save_info_for_recompression) {
    s->literals_block_splits.types = (uint8_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint8_t) * 20000);
    s->literals_block_splits.positions_begin = (uint32_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint32_t) * 20000);
    s->literals_block_splits.positions_end = (uint32_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint32_t) * 20000);
    s->literals_block_splits.num_types = 0;
    s->literals_block_splits.num_types_prev_metablocks = 0;
    s->literals_block_splits.num_blocks = 0;
    s->literals_block_splits.types_alloc_size = 20000;
    s->literals_block_splits.positions_alloc_size = 20000;

    s->insert_copy_length_block_splits.types = (uint8_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint8_t) * 20000);
    s->insert_copy_length_block_splits.positions_begin = (uint32_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint32_t) * 20000);
    s->insert_copy_length_block_splits.positions_end = (uint32_t*)BROTLI_DECODER_ALLOC(s, sizeof(uint32_t) * 20000);
    s->insert_copy_length_block_splits.num_types = 0;
    s->insert_copy_length_block_splits.num_types_prev_metablocks = 0;
    s->insert_copy_length_block_splits.num_blocks = 0;
    s->insert_copy_length_block_splits.types_alloc_size = 20000;
    s->insert_copy_length_block_splits.positions_alloc_size = 20000;
  }


  s->saved_position_literals_begin = BROTLI_FALSE;
  s->saved_position_lengths_begin = BROTLI_FALSE;

  s->block_type_trees = NULL;
  s->block_len_trees = NULL;
  s->ringbuffer = NULL;
  s->ringbuffer_size = 0;
  s->new_ringbuffer_size = 0;
  s->ringbuffer_mask = 0;

  s->context_map = NULL;
  s->context_modes = NULL;
  s->dist_context_map = NULL;
  s->context_map_slice = NULL;
  s->dist_context_map_slice = NULL;

  s->literal_hgroup.codes = NULL;
  s->literal_hgroup.htrees = NULL;
  s->insert_copy_hgroup.codes = NULL;
  s->insert_copy_hgroup.htrees = NULL;
  s->distance_hgroup.codes = NULL;
  s->distance_hgroup.htrees = NULL;

  s->is_last_metablock = 0;
  s->is_uncompressed = 0;
  s->is_metadata = 0;
  s->should_wrap_ringbuffer = 0;
  s->canny_ringbuffer_allocation = 1;

  s->window_bits = 0;
  s->max_distance = 0;
  s->dist_rb[0] = 16;
  s->dist_rb[1] = 15;
  s->dist_rb[2] = 11;
  s->dist_rb[3] = 4;
  s->dist_rb_idx = 0;
  s->block_type_trees = NULL;
  s->block_len_trees = NULL;

  s->mtf_upper_bound = 63;

  s->dictionary = BrotliGetDictionary();
  s->transforms = BrotliGetTransforms();

  return BROTLI_TRUE;
}